

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVPathRemote.cpp
# Opt level: O0

void __thiscall
adios2::EVPathRemote::Open
          (EVPathRemote *this,string *hostname,int32_t port,string *filename,Mode mode,
          bool RowMajorOrdering)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uVar5;
  EVPathRemote *in_RCX;
  int in_EDX;
  long in_RDI;
  int in_R8D;
  byte in_R9B;
  atom_t CM_IP_HOSTNAME;
  atom_t CM_IP_PORT;
  attr_list contact_list;
  _OpenFileMsg open_msg;
  int local_64;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffffa0;
  ulong local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  byte local_25;
  int local_24;
  int local_14;
  
  local_25 = in_R9B & 1;
  local_24 = in_R8D;
  local_14 = in_EDX;
  InitCMData(in_RCX);
  uVar3 = create_attr_list();
  uVar1 = attr_atom_from_string("IP_HOST");
  uVar2 = attr_atom_from_string("IP_PORT");
  pcVar4 = (char *)std::__cxx11::string::c_str();
  pcVar4 = strdup(pcVar4);
  add_attr(uVar3,uVar1,3,pcVar4);
  add_attr(uVar3,uVar2,1,(long)local_14);
  uVar5 = CMinitiate_conn(*(undefined8 *)(in_RDI + 0xa0),uVar3);
  *(undefined8 *)(in_RDI + 0x108) = uVar5;
  if ((*(long *)(in_RDI + 0x108) == 0) &&
     ((pcVar4 = getenv("DoRemote"), pcVar4 != (char *)0x0 ||
      (pcVar4 = getenv("DoFileRemote"), pcVar4 != (char *)0x0)))) {
    local_64 = 1000;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffffa0,&local_64);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_ffffffffffffffa0);
    uVar5 = CMinitiate_conn(*(undefined8 *)(in_RDI + 0xa0),uVar3);
    *(undefined8 *)(in_RDI + 0x108) = uVar5;
  }
  free_attr_list(uVar3);
  if (*(long *)(in_RDI + 0x108) != 0) {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    uStack_40 = std::__cxx11::string::c_str();
    if (local_24 == 2) {
      local_38 = (ulong)local_38._4_4_ << 0x20;
    }
    else if (local_24 == 4) {
      local_38 = CONCAT44(local_38._4_4_,1);
    }
    uVar1 = CMCondition_get(*(undefined8 *)(in_RDI + 0xa0),*(undefined8 *)(in_RDI + 0x108));
    local_48 = CONCAT44(local_48._4_4_,uVar1);
    local_38 = (ulong)(CONCAT14(local_25,(undefined4)local_38) & 0x1ffffffff);
    CMCondition_set_client_data(*(undefined8 *)(in_RDI + 0xa0),uVar1);
    CMwrite(*(undefined8 *)(in_RDI + 0x108),*(undefined8 *)(in_RDI + 0xa8),&local_48);
    CMCondition_wait(*(undefined8 *)(in_RDI + 0xa0),local_48 & 0xffffffff);
    *(undefined1 *)(in_RDI + 0x138) = 1;
  }
  return;
}

Assistant:

void EVPathRemote::Open(const std::string hostname, const int32_t port, const std::string filename,
                        const Mode mode, bool RowMajorOrdering)
{

    EVPathRemoteCommon::_OpenFileMsg open_msg;
    InitCMData();
    attr_list contact_list = create_attr_list();
    atom_t CM_IP_PORT = -1;
    atom_t CM_IP_HOSTNAME = -1;
    CM_IP_HOSTNAME = attr_atom_from_string("IP_HOST");
    CM_IP_PORT = attr_atom_from_string("IP_PORT");
    add_attr(contact_list, CM_IP_HOSTNAME, Attr_String, (attr_value)strdup(hostname.c_str()));
    add_attr(contact_list, CM_IP_PORT, Attr_Int4, (attr_value)port);
    m_conn = CMinitiate_conn(ev_state.cm, contact_list);
    if ((m_conn == NULL) && (getenv("DoRemote") || getenv("DoFileRemote")))
    {
        // if we didn't find a server, but we're in testing, wait briefly and try again
        std::this_thread::sleep_for(std::chrono::milliseconds(1000));
        m_conn = CMinitiate_conn(ev_state.cm, contact_list);
    }
    free_attr_list(contact_list);
    if (!m_conn)
        return;

    memset(&open_msg, 0, sizeof(open_msg));
    open_msg.FileName = (char *)filename.c_str();
    switch (mode)
    {
    case Mode::Read:
        open_msg.Mode = EVPathRemoteCommon::RemoteFileMode::RemoteOpen;
        break;
    case Mode::ReadRandomAccess:
        open_msg.Mode = EVPathRemoteCommon::RemoteFileMode::RemoteOpenRandomAccess;
        break;
    default:
        break;
    }
    open_msg.OpenResponseCondition = CMCondition_get(ev_state.cm, m_conn);
    open_msg.RowMajorOrder = RowMajorOrdering;
    CMCondition_set_client_data(ev_state.cm, open_msg.OpenResponseCondition, (void *)this);
    CMwrite(m_conn, ev_state.OpenFileFormat, &open_msg);
    CMCondition_wait(ev_state.cm, open_msg.OpenResponseCondition);
    m_Active = true;
}